

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool check_for_option(int argc,char **argv,char *pOption)

{
  int iVar1;
  int local_24;
  int i;
  char *pOption_local;
  char **argv_local;
  int argc_local;
  
  local_24 = 1;
  while( true ) {
    if (argc <= local_24) {
      return false;
    }
    if (((*argv[local_24] == '/') || (*argv[local_24] == '-')) &&
       (iVar1 = crnlib::crn_stricmp(argv[local_24] + 1,pOption), iVar1 == 0)) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

static bool check_for_option(int argc, char* argv[], const char* pOption)
{
    for (int i = 1; i < argc; i++)
    {
        if ((argv[i][0] == '/') || (argv[i][0] == '-'))
        {
            if (crn_stricmp(&argv[i][1], pOption) == 0)
                return true;
        }
    }
    return false;
}